

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

ssh_decompressor * zlib_decompress_init(void)

{
  undefined8 *puVar1;
  zlib_table *pzVar2;
  uchar lengths [288];
  
  puVar1 = (undefined8 *)safemalloc(1,0x81c8,0);
  memset(lengths,8,0x90);
  builtin_memcpy(lengths + 0x90,
                 "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                 ,0x90);
  pzVar2 = zlib_mktable(lengths,0x120);
  *puVar1 = pzVar2;
  builtin_memcpy(lengths,
                 "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                 ,0x20);
  pzVar2 = zlib_mktable(lengths,0x20);
  puVar1[1] = pzVar2;
  puVar1[0x35] = 0;
  *(undefined4 *)(puVar1 + 0x36) = 0;
  *(undefined4 *)((long)puVar1 + 0x81b4) = 0;
  puVar1[0x1037] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined8 *)((long)puVar1 + 0x1c) = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  puVar1[0x1038] = &ssh_zlib;
  return (ssh_decompressor *)(puVar1 + 0x1038);
}

Assistant:

ssh_decompressor *zlib_decompress_init(void)
{
    struct zlib_decompress_ctx *dctx = snew(struct zlib_decompress_ctx);
    unsigned char lengths[288];

    memset(lengths, 8, 144);
    memset(lengths + 144, 9, 256 - 144);
    memset(lengths + 256, 7, 280 - 256);
    memset(lengths + 280, 8, 288 - 280);
    dctx->staticlentable = zlib_mktable(lengths, 288);
    memset(lengths, 5, 32);
    dctx->staticdisttable = zlib_mktable(lengths, 32);
    dctx->state = START;                       /* even before header */
    dctx->currlentable = dctx->currdisttable = dctx->lenlentable = NULL;
    dctx->bits = 0;
    dctx->nbits = 0;
    dctx->winpos = 0;
    dctx->outblk = NULL;

    dctx->dc.vt = &ssh_zlib;
    return &dctx->dc;
}